

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascbin-cursor.c
# Opt level: O2

int get_relative_field_bit_offset_by_index
              (coda_cursor *cursor,long field_index,int64_t *rel_bit_offset)

{
  int64_t *piVar1;
  coda_dynamic_type_struct *pcVar2;
  uint __line;
  int iVar3;
  char *pcVar4;
  coda_expression *pcVar5;
  long lVar6;
  long lVar7;
  int available_1;
  int64_t prev_bit_offset;
  anon_struct_24_3_5e6533e2 *local_358;
  int64_t *local_350;
  int64_t bit_size;
  coda_cursor field_cursor;
  
  pcVar2 = cursor->stack[(long)cursor->n + -1].type;
  lVar7 = *(long *)(*(long *)(pcVar2 + 5) + field_index * 8);
  if (-1 < *(long *)(lVar7 + 0x28)) {
    *rel_bit_offset = *(long *)(lVar7 + 0x28);
    return 0;
  }
  pcVar5 = *(coda_expression **)(lVar7 + 0x30);
  if (pcVar5 == (coda_expression *)0x0) {
    if (field_index == 0) {
      pcVar4 = "field_index != 0";
      __line = 99;
    }
    else {
      lVar7 = field_index + -1;
      do {
        lVar6 = *(long *)(*(long *)(pcVar2 + 5) + lVar7 * 8);
        if ((*(long *)(lVar6 + 0x28) != -1) || (*(long *)(lVar6 + 0x30) != 0)) {
          local_350 = rel_bit_offset;
          iVar3 = get_relative_field_bit_offset_by_index(cursor,lVar7,&prev_bit_offset);
          if (iVar3 != 0) {
            return -1;
          }
          local_358 = cursor->stack;
          memcpy(&field_cursor,cursor,0x310);
          lVar6 = (long)field_cursor.n;
          field_cursor.n = field_cursor.n + 1;
          field_cursor.stack[lVar6].bit_offset =
               prev_bit_offset + local_358[(long)cursor->n + -1].bit_offset;
          goto LAB_00118e2b;
        }
        lVar6 = lVar7 + 1;
        lVar7 = lVar7 + -1;
      } while (1 < lVar6);
      pcVar4 = "index >= 0";
      __line = 0x6e;
    }
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascbin-cursor.c"
                  ,__line,
                  "int get_relative_field_bit_offset_by_index(const coda_cursor *, long, int64_t *)"
                 );
  }
  if (*(coda_expression **)(lVar7 + 0x20) != (coda_expression *)0x0) {
    iVar3 = coda_expression_eval_bool
                      (*(coda_expression **)(lVar7 + 0x20),cursor,(int *)&field_cursor);
    if (iVar3 != 0) {
      pcVar4 = " for available expression";
      goto LAB_00118ee4;
    }
    if ((int)field_cursor.product == 0) {
      if (field_index == 0) {
        *rel_bit_offset = 0;
        return 0;
      }
      iVar3 = get_relative_field_bit_offset_by_index(cursor,field_index + -1,rel_bit_offset);
      return iVar3;
    }
    pcVar5 = *(coda_expression **)(lVar7 + 0x30);
  }
  iVar3 = coda_expression_eval_integer(pcVar5,cursor,rel_bit_offset);
  if (iVar3 == 0) {
    return 0;
  }
  pcVar4 = " for offset expression";
LAB_00118ee4:
  coda_add_error_message(pcVar4);
  coda_cursor_add_to_error_message(cursor);
  return -1;
LAB_00118e2b:
  if (field_index <= lVar7) {
    *local_350 = prev_bit_offset;
    return 0;
  }
  available_1 = 1;
  pcVar5 = *(coda_expression **)(*(long *)(*(long *)(pcVar2 + 5) + lVar7 * 8) + 0x20);
  if (pcVar5 == (coda_expression *)0x0) {
LAB_00118e69:
    field_cursor.stack[(long)field_cursor.n + -1].type =
         *(coda_dynamic_type_struct **)(*(long *)(*(long *)(pcVar2 + 5) + lVar7 * 8) + 0x10);
    field_cursor.stack[(long)field_cursor.n + -1].index = lVar7;
    iVar3 = coda_cursor_get_bit_size(&field_cursor,&bit_size);
    if (iVar3 != 0) {
      return -1;
    }
    prev_bit_offset = prev_bit_offset + bit_size;
    piVar1 = &field_cursor.stack[(long)field_cursor.n + -1].bit_offset;
    *piVar1 = *piVar1 + bit_size;
  }
  else {
    iVar3 = coda_expression_eval_bool(pcVar5,cursor,&available_1);
    if (iVar3 != 0) {
      coda_add_error_message(" for available expression");
      return -1;
    }
    if (available_1 != 0) goto LAB_00118e69;
  }
  lVar7 = lVar7 + 1;
  goto LAB_00118e2b;
}

Assistant:

static int get_relative_field_bit_offset_by_index(const coda_cursor *cursor, long field_index, int64_t *rel_bit_offset)
{
    coda_type_record_field *field;
    coda_type_record *record;
    coda_cursor field_cursor;
    int64_t prev_bit_offset;
    long index;
    long i;

    record = (coda_type_record *)cursor->stack[cursor->n - 1].type;
    field = record->field[field_index];

    if (field->bit_offset >= 0)
    {
        /* use static offset */
        *rel_bit_offset = field->bit_offset;
        return 0;
    }

    if (field->bit_offset_expr != NULL)
    {
        if (field->available_expr != NULL)
        {
            int available;

            if (coda_expression_eval_bool(field->available_expr, cursor, &available) != 0)
            {
                coda_add_error_message(" for available expression");
                coda_cursor_add_to_error_message(cursor);
                return -1;
            }
            /* don't evaluate offset expression if field is not available! */
            if (!available)
            {
                if (field_index == 0)
                {
                    /* Just set to 0. With a proper format definition you should actually never have this case. */
                    *rel_bit_offset = 0;
                    return 0;
                }
                else
                {
                    /* the size of this field is zero, so just use the offset of the previous field */
                    return get_relative_field_bit_offset_by_index(cursor, field_index - 1, rel_bit_offset);
                }
            }
        }
        /* determine offset using expr */
        if (coda_expression_eval_integer(field->bit_offset_expr, cursor, rel_bit_offset) != 0)
        {
            coda_add_error_message(" for offset expression");
            coda_cursor_add_to_error_message(cursor);
            return -1;
        }
        return 0;
    }

    assert(field_index != 0);   /* the first field should either have a fixed bit offset or a bit_offset_expr */

    /* determine offset by:
     *  - finding previous field with a fixed bit_offset or a bit_offset_expr
     *  - calculating the bit offset for that field
     *  - adding bit sizes of fields after that offset until we get to our field
     */
    index = field_index - 1;
    while (record->field[index]->bit_offset == -1 && record->field[index]->bit_offset_expr == NULL)
    {
        index--;
        assert(index >= 0);
    }
    if (get_relative_field_bit_offset_by_index(cursor, index, &prev_bit_offset) != 0)
    {
        return -1;
    }
    field_cursor = *cursor;
    field_cursor.n++;
    field_cursor.stack[field_cursor.n - 1].bit_offset = cursor->stack[cursor->n - 1].bit_offset + prev_bit_offset;
    for (i = index; i < field_index; i++)
    {
        int64_t bit_size;
        int available = 1;

        if (record->field[i]->available_expr != NULL)
        {
            if (coda_expression_eval_bool(record->field[i]->available_expr, cursor, &available) != 0)
            {
                coda_add_error_message(" for available expression");
                return -1;
            }
        }
        if (available)
        {
            field_cursor.stack[field_cursor.n - 1].type = (coda_dynamic_type *)record->field[i]->type;
            field_cursor.stack[field_cursor.n - 1].index = i;
            if (coda_cursor_get_bit_size(&field_cursor, &bit_size) != 0)
            {
                return -1;
            }
            prev_bit_offset += bit_size;
            field_cursor.stack[field_cursor.n - 1].bit_offset += bit_size;
        }
    }
    *rel_bit_offset = prev_bit_offset;

    return 0;
}